

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall trackerboy::Player::step(Player *this)

{
  anon_class_16_2_f7cbea5a local_30;
  undefined1 local_20 [8];
  Frame frame;
  Player *this_local;
  
  if ((this->mPlaying & 1U) != 0) {
    frame._8_8_ = this;
    Frame::Frame((Frame *)local_20);
    Engine::step(this->mEngine,(Frame *)local_20);
    if ((local_20[0] & 1U) == 0) {
      local_30.frame = (Frame *)local_20;
      local_30.this = this;
      std::
      visit<trackerboy::Player::step()::__0,std::variant<std::monostate,trackerboy::Player::LoopContext,trackerboy::Player::DurationContext>&>
                (&local_30,&this->mContext);
    }
    else {
      this->mPlaying = false;
    }
  }
  return;
}

Assistant:

void Player::step() {
    if (mPlaying) {
        Frame frame;
        mEngine.step(frame);

        if (frame.halted) {
            mPlaying = false;
        } else {
            // check if we have another step via our context variant
            std::visit([this, &frame](auto&& ctx) {
                using T = std::decay_t<decltype(ctx)>;

                if constexpr (std::is_same_v<T, LoopContext>) {
                    if (frame.startedNewPattern) {
                        if (ctx.visits[frame.order]++ == ctx.loopAmount) {
                            mPlaying = false;
                        }
                        ctx.currentPattern = frame.order;
                    }
                } else if constexpr (std::is_same_v<T, DurationContext>) {
                    if (++ctx.frameCounter >= ctx.framesToPlay) {
                        mPlaying = false;
                    }
                } else {
                    // T is monostate, should not happen
                    mPlaying = false; // stop playing, class was incorrectly constructed
                }
                

            }, mContext);

        }


    }
}